

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__profile_GLSL__technique__pass__fog_end
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  bool bVar1;
  undefined8 in_RAX;
  profile_GLSL__technique__pass__fog_end__AttributeData *ppVar2;
  undefined *puVar3;
  xmlChar **ppxVar4;
  bool bVar5;
  float fVar6;
  undefined8 uStack_38;
  bool failed;
  
  uStack_38 = in_RAX;
  ppVar2 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL14::profile_GLSL__technique__pass__fog_end__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar4 = attributes->attributes;
  if (ppxVar4 == (xmlChar **)0x0) {
    bVar5 = true;
  }
  else {
    while( true ) {
      text = *ppxVar4;
      bVar5 = text == (ParserChar *)0x0;
      if (bVar5) break;
      puVar3 = (undefined *)GeneratedSaxParser::Utils::calculateStringHash(text);
      additionalText = ppxVar4[1];
      if (puVar3 == (undefined *)0x76887d) {
        ppVar2->param = additionalText;
      }
      else if (puVar3 == &DAT_007c83b5) {
        fVar6 = GeneratedSaxParser::Utils::toFloat(additionalText,&failed);
        ppVar2->value = fVar6;
        if ((failed == true) &&
           (bVar5 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0xd5d5c24,0x7c83b5,additionalText),
           bVar5)) {
          return false;
        }
      }
      else {
        bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0xd5d5c24,text,additionalText);
        if (bVar1) {
          return bVar5;
        }
      }
      ppxVar4 = ppxVar4 + 2;
    }
  }
  return bVar5;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__profile_GLSL__technique__pass__fog_end( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLSL__technique__pass__fog_end( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLSL__technique__pass__fog_end__AttributeData* attributeData = newData<profile_GLSL__technique__pass__fog_end__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_value:
    {
bool failed;
attributeData->value = GeneratedSaxParser::Utils::toFloat(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_FOG_END,
        HASH_ATTRIBUTE_value,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_param:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_FOG_END,
            HASH_ATTRIBUTE_param,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_FOG_END, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}